

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

CK_RV __thiscall Token::initUserPIN(Token *this,ByteString *pin)

{
  ObjectStoreToken *pOVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  CK_RV CVar5;
  MutexLocker lock;
  ByteString userPINBlob;
  ByteString soPINBlob;
  ByteString local_48;
  
  MutexLocker::MutexLocker(&lock,this->tokenMutex);
  CVar5 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    bVar2 = SecureDataManager::setUserPIN(this->sdm,pin);
    if (bVar2) {
      pOVar1 = this->token;
      SecureDataManager::getUserPINBlob(&local_48,this->sdm);
      iVar4 = (*pOVar1->_vptr_ObjectStoreToken[2])(pOVar1,&local_48);
      ByteString::~ByteString(&local_48);
      if ((char)iVar4 != '\0') {
        ByteString::ByteString(&soPINBlob);
        ByteString::ByteString(&userPINBlob);
        iVar4 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&soPINBlob);
        if ((char)iVar4 == '\0') {
          uVar3 = false;
        }
        else {
          iVar4 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&userPINBlob);
          uVar3 = (undefined1)iVar4;
        }
        this->valid = (bool)uVar3;
        ByteString::~ByteString(&userPINBlob);
        ByteString::~ByteString(&soPINBlob);
        CVar5 = 0;
      }
    }
  }
  MutexLocker::~MutexLocker(&lock);
  return CVar5;
}

Assistant:

CK_RV Token::initUserPIN(ByteString& pin)
{
	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	if (sdm->setUserPIN(pin) == false) return CKR_GENERAL_ERROR;

	// Save PIN to token file
	if (token->setUserPIN(sdm->getUserPINBlob()) == false) return CKR_GENERAL_ERROR;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	return CKR_OK;
}